

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

Result __thiscall
wabt::MemoryStream::MoveDataImpl(MemoryStream *this,size_t dst_offset,size_t src_offset,size_t size)

{
  OutputBuffer *this_00;
  long lVar1;
  ulong __new_size;
  
  if (size != 0) {
    __new_size = dst_offset + size;
    if (dst_offset + size < size + src_offset) {
      __new_size = size + src_offset;
    }
    this_00 = (this->buf_)._M_t.
              super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
              .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl;
    lVar1 = *(long *)&(this_00->data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
    if ((ulong)((long)*(pointer *)
                       ((long)&(this_00->data).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl + 8) - lVar1) < __new_size) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this_00->data,__new_size);
      lVar1 = *(long *)&(((this->buf_)._M_t.
                          super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
                          .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl)->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
    }
    memmove((void *)(dst_offset + lVar1),(void *)(src_offset + lVar1),size);
  }
  return (Result)Ok;
}

Assistant:

Result MemoryStream::MoveDataImpl(size_t dst_offset,
                                  size_t src_offset,
                                  size_t size) {
  if (size == 0) {
    return Result::Ok;
  }
  size_t src_end = src_offset + size;
  size_t dst_end = dst_offset + size;
  size_t end = src_end > dst_end ? src_end : dst_end;
  if (end > buf_->data.size()) {
    buf_->data.resize(end);
  }

  uint8_t* dst = &buf_->data[dst_offset];
  uint8_t* src = &buf_->data[src_offset];
  memmove(dst, src, size);
  return Result::Ok;
}